

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

cio_http_cb_return
check_websocket_protocol(cio_websocket_location_handler *handler,char *at,size_t length)

{
  protocol_find_ret pVar1;
  char *pcVar2;
  char *pcStack_40;
  protocol_find_ret ret;
  size_t word_len;
  char *end;
  char *start;
  size_t length_local;
  char *at_local;
  cio_websocket_location_handler *handler_local;
  
  end = at;
  start = (char *)length;
  if (handler->subprotocols == (char **)0x0) {
    handler_local._4_4_ = CIO_HTTP_CB_SUCCESS;
  }
  else {
    do {
      pcVar2 = find_delimiter(end,(size_t)start);
      if (pcVar2 == (char *)0x0) {
        pcStack_40 = start;
      }
      else {
        pcStack_40 = pcVar2 + -(long)end;
      }
      pVar1 = handle_word(handler,end,(size_t)pcStack_40);
      if (pVar1 == WS_PROTOCOL_FOUND) {
        return CIO_HTTP_CB_SUCCESS;
      }
      if (pVar1 == WS_PROTOCOL_ERROR) {
        return CIO_HTTP_CB_ERROR;
      }
      end = end + 1 + (long)pcStack_40;
      start = start + (-1 - (long)pcStack_40);
    } while (pcVar2 != (char *)0x0);
    handler_local._4_4_ = CIO_HTTP_CB_ERROR;
  }
  return handler_local._4_4_;
}

Assistant:

static enum cio_http_cb_return check_websocket_protocol(struct cio_websocket_location_handler *handler, const char *at, size_t length)
{
	if (handler->subprotocols == NULL) {
		return CIO_HTTP_CB_SUCCESS;
	}

	const char *start = at;
	const char *end = NULL;
	do {
		end = find_delimiter(start, length);
		size_t word_len = 0;
		if (end != NULL) {
			word_len = (size_t)(ptrdiff_t)(end - start);
		} else {
			word_len = length;
		}

		enum protocol_find_ret ret = handle_word(handler, start, word_len);
		if (ret == WS_PROTOCOL_FOUND) {
			return CIO_HTTP_CB_SUCCESS;
		}

		if (ret == WS_PROTOCOL_ERROR) {
			return CIO_HTTP_CB_ERROR;
		}

		start = start + 1 + word_len;
		length = length - 1 - word_len;
	} while (end != NULL);

	return CIO_HTTP_CB_ERROR;
}